

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

void Abc_SclTimeCone(SC_Man *p,Vec_Int_t *vCone)

{
  Abc_Ntk_t *pNtk;
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_2c;
  int i;
  Abc_Obj_t *pObj;
  int fVerbose;
  Vec_Int_t *vCone_local;
  SC_Man *p_local;
  
  Abc_SclConeClean(p,vCone);
  for (local_2c = 0; iVar1 = Vec_IntSize(vCone), local_2c < iVar1; local_2c = local_2c + 1) {
    pNtk = p->pNtk;
    iVar1 = Vec_IntEntry(vCone,local_2c);
    pObj_00 = Abc_NtkObj(pNtk,iVar1);
    if (pObj_00 != (Abc_Obj_t *)0x0) {
      Abc_SclTimeNode(p,pObj_00,0);
    }
  }
  return;
}

Assistant:

void Abc_SclTimeCone( SC_Man * p, Vec_Int_t * vCone )
{
    int fVerbose = 0;
    Abc_Obj_t * pObj;
    int i;
    Abc_SclConeClean( p, vCone );
    Abc_NtkForEachObjVec( vCone, p->pNtk, pObj, i )
    {
        if ( fVerbose && Abc_ObjIsNode(pObj) )
        printf( "  Updating node %d with gate %s\n", Abc_ObjId(pObj), Abc_SclObjCell(pObj)->pName );
        if ( fVerbose && Abc_ObjIsNode(pObj) )
        printf( "    before (%6.1f ps  %6.1f ps)   ", Abc_SclObjTimeOne(p, pObj, 1), Abc_SclObjTimeOne(p, pObj, 0) );
        Abc_SclTimeNode( p, pObj, 0 );
        if ( fVerbose && Abc_ObjIsNode(pObj) )
        printf( "after (%6.1f ps  %6.1f ps)\n", Abc_SclObjTimeOne(p, pObj, 1), Abc_SclObjTimeOne(p, pObj, 0) );
    }
}